

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildInt(int base,string_view t_val,bool prefixed)

{
  bool bVar1;
  bool bVar2;
  _Alloc_hider __nptr;
  int *piVar3;
  pointer pcVar4;
  int iVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int __base;
  char *pcVar8;
  undefined4 in_register_0000003c;
  element_type *this;
  byte in_R8B;
  bool bVar9;
  Boxed_Value BVar10;
  undefined1 auVar11 [12];
  string local_70;
  int local_4c;
  long local_48;
  char *local_40;
  pointer local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  this = (element_type *)CONCAT44(in_register_0000003c,base);
  pcVar6 = t_val._M_str;
  __base = (int)t_val._M_len;
  if (pcVar6 == (char *)0x0) {
    bVar2 = false;
    bVar1 = false;
    bVar9 = false;
  }
  else {
    bVar9 = false;
    bVar1 = false;
    bVar2 = false;
    pcVar8 = pcVar6;
    do {
      if ((pcVar8[CONCAT71(in_register_00000009,prefixed) + -1] & 0xdfU) == 0x55) {
        bVar9 = true;
      }
      else {
        if ((pcVar8[CONCAT71(in_register_00000009,prefixed) + -1] & 0xdfU) != 0x4c) break;
        if (bVar1) {
          bVar2 = true;
        }
        bVar1 = true;
      }
      pcVar8 = pcVar8 + -1;
    } while (pcVar8 != (char *)0x0);
  }
  local_40 = pcVar6 + -2;
  if (in_R8B == 0) {
    local_40 = pcVar6;
  }
  local_48 = CONCAT71(in_register_00000009,prefixed) + (ulong)in_R8B * 2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_40 = local_40 + local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,local_48,local_40);
  __nptr._M_p = local_70._M_dataplus._M_p;
  piVar3 = __errno_location();
  local_4c = *piVar3;
  *piVar3 = 0;
  pcVar4 = (pointer)strtoll(__nptr._M_p,&local_38,__base);
  if (local_38 == __nptr._M_p) {
    auVar11 = std::__throw_invalid_argument("stoll");
    if (auVar11._8_4_ != 1) {
      _Unwind_Resume(auVar11._0_8_);
    }
    __cxa_begin_catch(auVar11._0_8_);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,local_48,local_40);
    pcVar4 = (pointer)std::__cxx11::stoull(&local_70,(size_t *)0x0,__base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = pcVar4;
    if (bVar2) {
      detail::const_var_impl<unsigned_long_long>((detail *)this,(unsigned_long_long *)&local_70);
    }
    else {
      detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_70);
    }
    __cxa_end_catch();
    _Var7._M_pi = extraout_RDX;
    goto LAB_00342c24;
  }
  if (*piVar3 == 0) {
LAB_00342b36:
    *piVar3 = local_4c;
  }
  else if (*piVar3 == 0x22) {
    std::__throw_out_of_range("stoll");
    goto LAB_00342b36;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar5 = (int)pcVar4;
  local_70._M_dataplus._M_p = pcVar4;
  if (bVar9) {
    if ((bool)((ulong)pcVar4 >> 0x20 != 0 | bVar1)) {
      if (bVar2) {
        BVar10 = detail::const_var_impl<unsigned_long_long>
                           ((detail *)this,(unsigned_long_long *)&local_70);
        _Var7._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        BVar10 = detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_70);
        _Var7._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      goto LAB_00342c24;
    }
  }
  else {
    if ((pointer)(long)iVar5 == pcVar4 && !bVar1) {
      local_70._M_dataplus._M_p._0_4_ = iVar5;
      BVar10 = detail::const_var_impl<int>((detail *)this,(int *)&local_70);
      _Var7._M_pi = BVar10.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      goto LAB_00342c24;
    }
    if ((__base == 10) || ((ulong)pcVar4 >> 0x20 != 0 || bVar1)) {
      if (bVar2) {
        BVar10 = detail::const_var_impl<long_long>((detail *)this,(longlong *)&local_70);
        _Var7._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        BVar10 = detail::const_var_impl<long>((detail *)this,(long *)&local_70);
        _Var7._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      goto LAB_00342c24;
    }
  }
  local_70._M_dataplus._M_p._0_4_ = iVar5;
  BVar10 = detail::const_var_impl<unsigned_int>((detail *)this,(uint *)&local_70);
  _Var7._M_pi = BVar10.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_00342c24:
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (Boxed_Value)
         BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildInt(const int base, std::string_view t_val, const bool prefixed) {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          const char val = t_val[i - 1];

          if (val == 'u' || val == 'U') {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_) {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        if (prefixed) {
          t_val.remove_prefix(2);
        }

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#pragma GCC diagnostic ignored "-Wtautological-unsigned-zero-compare"
#pragma GCC diagnostic ignored "-Wtautological-type-limit-compare"
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif

#endif

        try {
          /// TODO fix this to use from_chars
          auto u = std::stoll(std::string(t_val), nullptr, base);

          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min()
                     && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min()
                     && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            /// TODO fix this to use from_chars
            auto u = std::stoull(std::string(t_val), nullptr, base);

            if (!longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }